

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexConvexAlgorithm::processCollision::btWithoutMarginResult::addContactPoint
          (btWithoutMarginResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorldOrg,
          btScalar depthOrg)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  btVector3 *in_RDI;
  btScalar in_XMM0_Da;
  btVector3 bVar2;
  btVector3 adjustedPointB;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 local_2c;
  undefined8 local_24;
  btScalar local_1c;
  undefined8 *local_10;
  
  in_RDI[2].m_floats[2] = in_XMM0_Da;
  uVar1 = in_RSI[1];
  *(undefined8 *)in_RDI[1].m_floats = *in_RSI;
  *(undefined8 *)(in_RDI[1].m_floats + 2) = uVar1;
  local_1c = in_XMM0_Da;
  local_10 = in_RSI;
  bVar2 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_RDI->m_floats);
  bVar2 = operator-((btVector3 *)CONCAT44(bVar2.m_floats[0],in_stack_ffffffffffffffc0),in_RDI);
  local_24 = bVar2.m_floats._8_8_;
  local_2c = bVar2.m_floats._0_8_;
  in_RDI[2].m_floats[2] = local_1c + in_RDI[2].m_floats[0] + in_RDI[2].m_floats[1];
  if (in_RDI[2].m_floats[2] <= 0.0 && in_RDI[2].m_floats[2] != 0.0) {
    *(undefined1 *)(in_RDI[2].m_floats + 3) = 1;
  }
  (**(code **)(**(long **)(in_RDI->m_floats + 2) + 0x20))
            (in_RDI[2].m_floats[2],*(long **)(in_RDI->m_floats + 2),local_10,&local_2c);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorldOrg,btScalar depthOrg) 
			{
				m_reportedDistance = depthOrg;
				m_reportedNormalOnWorld = normalOnBInWorld;
				
				btVector3 adjustedPointB = pointInWorldOrg - normalOnBInWorld*m_marginOnB;
				m_reportedDistance = depthOrg+(m_marginOnA+m_marginOnB);
				if (m_reportedDistance<0.f)
				{
					m_foundResult = true;					
				}
				m_originalResult->addContactPoint(normalOnBInWorld,adjustedPointB,m_reportedDistance);
			}